

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqdebug.cpp
# Opt level: O2

void __thiscall
SQVM::Raise_ParamTypeError(SQVM *this,SQInteger nparam,SQInteger typemask,SQInteger type)

{
  SQUnsignedInteger *pSVar1;
  SQSharedState *ss;
  SQChar *pSVar2;
  SQInteger i;
  ulong uVar3;
  long lVar4;
  SQObjectPtr local_68;
  SQObjectPtr exptypes;
  
  exptypes.super_SQObject._unVal.pString = SQString::Create(this->_sharedstate,"",-1);
  exptypes.super_SQObject._type = OT_STRING;
  pSVar1 = &((exptypes.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  lVar4 = 0;
  for (uVar3 = 0; uVar3 != 0x10; uVar3 = uVar3 + 1) {
    if (((ulong)typemask >> (uVar3 & 0x3f) & 1) != 0) {
      if (0 < lVar4) {
        local_68.super_SQObject._unVal.pString = SQString::Create(this->_sharedstate,"|",-1);
        local_68.super_SQObject._type = OT_STRING;
        pSVar1 = &((local_68.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                  super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
        StringCat(this,&exptypes,&local_68,&exptypes);
        SQObjectPtr::~SQObjectPtr(&local_68);
      }
      ss = this->_sharedstate;
      pSVar2 = IdType2Name((SQObjectType)(1L << ((byte)uVar3 & 0x3f)));
      local_68.super_SQObject._unVal.pString = SQString::Create(ss,pSVar2,-1);
      local_68.super_SQObject._type = OT_STRING;
      pSVar1 = &((local_68.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
      StringCat(this,&exptypes,&local_68,&exptypes);
      lVar4 = lVar4 + 1;
      SQObjectPtr::~SQObjectPtr(&local_68);
    }
  }
  pSVar2 = IdType2Name((SQObjectType)type);
  Raise_Error(this,"parameter %d has an invalid type \'%s\' ; expected: \'%s\'",nparam,pSVar2,
              &(exptypes.super_SQObject._unVal.pTable)->_firstfree);
  SQObjectPtr::~SQObjectPtr(&exptypes);
  return;
}

Assistant:

void SQVM::Raise_ParamTypeError(SQInteger nparam,SQInteger typemask,SQInteger type)
{
    SQObjectPtr exptypes = SQString::Create(_ss(this), _SC(""), -1);
    SQInteger found = 0;
    for(SQInteger i=0; i<16; i++)
    {
        SQInteger mask = ((SQInteger)1) << i;
        if(typemask & (mask)) {
            if(found>0) StringCat(exptypes,SQString::Create(_ss(this), _SC("|"), -1), exptypes);
            found ++;
            StringCat(exptypes,SQString::Create(_ss(this), IdType2Name((SQObjectType)mask), -1), exptypes);
        }
    }
    Raise_Error(_SC("parameter %d has an invalid type '%s' ; expected: '%s'"), nparam, IdType2Name((SQObjectType)type), _stringval(exptypes));
}